

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

bool __thiscall cmCTestLaunch::CheckResults(cmCTestLaunch *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((this->Passthru == false) &&
     (((this->ExitCode != 0 ||
       ((this->HaveErr == true && (bVar1 = ScrapeLog(this,&this->LogErr), bVar1)))) ||
      ((this->HaveOut == true && (bVar1 = ScrapeLog(this,&this->LogOut), bVar1)))))) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmCTestLaunch::CheckResults()
{
  // Skip XML in passthru mode.
  if (this->Passthru) {
    return true;
  }

  // We always report failure for error conditions.
  if (this->IsError()) {
    return false;
  }

  // Scrape the output logs to look for warnings.
  if ((this->HaveErr && this->ScrapeLog(this->LogErr)) ||
      (this->HaveOut && this->ScrapeLog(this->LogOut))) {
    return false;
  }
  return true;
}